

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::EndIntOverflowDoesNotMatterRange(BackwardPass *this)

{
  IntOverflowDoesNotMatterRange *this_00;
  BasicBlock *pBVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  uint uVar3;
  Instr *pIVar4;
  Instr *pIVar5;
  IntOverflowDoesNotMatterRange *pIVar6;
  PragmaInstr *pPVar7;
  JITTimeFunctionBody *this_01;
  char16 *pcVar8;
  char16 *pcVar9;
  BVSparse<Memory::JitArenaAllocator> *bv1;
  BVSparse<Memory::JitArenaAllocator> *bv2;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  Instr *boundaryInstr;
  IntOverflowDoesNotMatterRange *rangeToDelete;
  BackwardPass *this_local;
  
  if ((this->intOverflowCurrentlyMattersInRange & 1U) == 0) {
    this->intOverflowCurrentlyMattersInRange = true;
    pIVar4 = IntOverflowDoesNotMatterRange::FirstInstr
                       (this->currentBlock->intOverflowDoesNotMatterRange);
    pIVar4 = pIVar4->m_next;
    pIVar5 = IntOverflowDoesNotMatterRange::LastInstr
                       (this->currentBlock->intOverflowDoesNotMatterRange);
    if (pIVar4 == pIVar5) {
      this_00 = this->currentBlock->intOverflowDoesNotMatterRange;
      pIVar6 = IntOverflowDoesNotMatterRange::Next
                         (this->currentBlock->intOverflowDoesNotMatterRange);
      this->currentBlock->intOverflowDoesNotMatterRange = pIVar6;
      pBVar1 = this->currentBlock;
      pIVar4 = IntOverflowDoesNotMatterRange::LastInstr(this_00);
      BasicBlock::RemoveInstr(pBVar1,pIVar4);
      IntOverflowDoesNotMatterRange::Delete(this_00,this->globOpt->alloc);
    }
    else {
      pIVar4 = IntOverflowDoesNotMatterRange::FirstInstr
                         (this->currentBlock->intOverflowDoesNotMatterRange);
      pPVar7 = IR::PragmaInstr::New(NoIntOverflowBoundary,0,pIVar4->m_func);
      unique0x10000424 = pPVar7;
      pIVar4 = IntOverflowDoesNotMatterRange::FirstInstr
                         (this->currentBlock->intOverflowDoesNotMatterRange);
      IR::Instr::SetByteCodeOffset(&pPVar7->super_Instr,pIVar4);
      pPVar7 = stack0xffffffffffffffe0;
      pBVar1 = this->currentBlock;
      pIVar4 = IntOverflowDoesNotMatterRange::FirstInstr
                         (this->currentBlock->intOverflowDoesNotMatterRange);
      BasicBlock::InsertInstrBefore(pBVar1,&pPVar7->super_Instr,pIVar4);
      IntOverflowDoesNotMatterRange::SetFirstInstr
                (this->currentBlock->intOverflowDoesNotMatterRange,
                 &stack0xffffffffffffffe0->super_Instr);
      sourceContextId = Func::GetSourceContextId(this->func);
      functionId = Func::GetLocalFunctionId(this->func);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01ec1678,TrackCompoundedIntOverflowPhase,sourceContextId,
                         functionId);
      if (bVar2) {
        this_01 = Func::GetJITFunctionBody(this->func);
        pcVar8 = JITTimeFunctionBody::GetDisplayName(this_01);
        pcVar9 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_78);
        uVar3 = BasicBlock::GetBlockNum(this->currentBlock);
        Output::Print(L"TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n",
                      pcVar8,pcVar9,0x179618a,(ulong)uVar3);
        Output::Print(L"    Input syms to be int-specialized (lossless): ");
        pBVar10 = this->candidateSymsRequiredToBeInt;
        bv1 = IntOverflowDoesNotMatterRange::SymsRequiredToBeInt
                        (this->currentBlock->intOverflowDoesNotMatterRange);
        bv2 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                        (this->currentBlock->intOverflowDoesNotMatterRange);
        BVSparse<Memory::JitArenaAllocator>::Minus(pBVar10,bv1,bv2);
        BVSparse<Memory::JitArenaAllocator>::Dump(this->candidateSymsRequiredToBeInt);
        Output::Print(L"    Input syms to be converted to int (lossy):   ");
        pBVar10 = IntOverflowDoesNotMatterRange::SymsRequiredToBeLossyInt
                            (this->currentBlock->intOverflowDoesNotMatterRange);
        BVSparse<Memory::JitArenaAllocator>::Dump(pBVar10);
        Output::Print(L"    First instr: ");
        pIVar4 = IntOverflowDoesNotMatterRange::FirstInstr
                           (this->currentBlock->intOverflowDoesNotMatterRange);
        IR::Instr::Dump(pIVar4->m_next);
        Output::Flush();
      }
    }
    BVSparse<Memory::JitArenaAllocator>::ClearAll(this->candidateSymsRequiredToBeInt);
    BVSparse<Memory::JitArenaAllocator>::ClearAll(this->candidateSymsRequiredToBeLossyInt);
    BVSparse<Memory::JitArenaAllocator>::ClearAll(this->intOverflowDoesNotMatterInRangeBySymId);
  }
  return;
}

Assistant:

void
BackwardPass::EndIntOverflowDoesNotMatterRange()
{
    if(intOverflowCurrentlyMattersInRange)
    {
        return;
    }
    intOverflowCurrentlyMattersInRange = true;

    if(currentBlock->intOverflowDoesNotMatterRange->FirstInstr()->m_next ==
        currentBlock->intOverflowDoesNotMatterRange->LastInstr())
    {
        // Don't need a range for a single-instruction range
        IntOverflowDoesNotMatterRange *const rangeToDelete = currentBlock->intOverflowDoesNotMatterRange;
        currentBlock->intOverflowDoesNotMatterRange = currentBlock->intOverflowDoesNotMatterRange->Next();
        currentBlock->RemoveInstr(rangeToDelete->LastInstr());
        rangeToDelete->Delete(globOpt->alloc);
    }
    else
    {
        // End the current range of instructions where int overflow does not matter
        IR::Instr *const boundaryInstr =
            IR::PragmaInstr::New(
                Js::OpCode::NoIntOverflowBoundary,
                0,
                currentBlock->intOverflowDoesNotMatterRange->FirstInstr()->m_func);
        boundaryInstr->SetByteCodeOffset(currentBlock->intOverflowDoesNotMatterRange->FirstInstr());
        currentBlock->InsertInstrBefore(boundaryInstr, currentBlock->intOverflowDoesNotMatterRange->FirstInstr());
        currentBlock->intOverflowDoesNotMatterRange->SetFirstInstr(boundaryInstr);

#if DBG_DUMP
        if(PHASE_TRACE(Js::TrackCompoundedIntOverflowPhase, func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("TrackCompoundedIntOverflow - Top function: %s (%s), Phase: %s, Block: %u\n"),
                func->GetJITFunctionBody()->GetDisplayName(),
                func->GetDebugNumberSet(debugStringBuffer),
                Js::PhaseNames[Js::BackwardPhase],
                currentBlock->GetBlockNum());
            Output::Print(_u("    Input syms to be int-specialized (lossless): "));
            candidateSymsRequiredToBeInt->Minus(
                currentBlock->intOverflowDoesNotMatterRange->SymsRequiredToBeInt(),
                currentBlock->intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()); // candidate bit-vectors are cleared below anyway
            candidateSymsRequiredToBeInt->Dump();
            Output::Print(_u("    Input syms to be converted to int (lossy):   "));
            currentBlock->intOverflowDoesNotMatterRange->SymsRequiredToBeLossyInt()->Dump();
            Output::Print(_u("    First instr: "));
            currentBlock->intOverflowDoesNotMatterRange->FirstInstr()->m_next->Dump();
            Output::Flush();
        }
#endif
    }

    // Reset candidates for the next range
    candidateSymsRequiredToBeInt->ClearAll();
    candidateSymsRequiredToBeLossyInt->ClearAll();

    // Syms are not tracked across different ranges of instructions where int overflow does not matter, since instructions
    // between the ranges may bail out. The value of the dst of an int operation where overflow is ignored is incorrect until
    // the last use of that sym is converted to int. If the int operation and the last use of the sym are in different ranges
    // and an instruction between the ranges bails out, other inputs into the second range are no longer guaranteed to be ints,
    // so the incorrect value of the sym may be used in non-int operations.
    intOverflowDoesNotMatterInRangeBySymId->ClearAll();
}